

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void kj::ctor<kj::_::ImmediatePromiseNode<kj::AuthenticatedStream>,kj::AuthenticatedStream>
               (ImmediatePromiseNode<kj::AuthenticatedStream> *location,AuthenticatedStream *params)

{
  undefined8 uVar1;
  ExceptionOr<kj::AuthenticatedStream> local_1c8;
  
  local_1c8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1c8.value.ptr.isSet = true;
  local_1c8.value.ptr.field_1.value.stream.disposer = (params->stream).disposer;
  local_1c8.value.ptr.field_1.value.stream.ptr = (params->stream).ptr;
  (params->stream).ptr = (AsyncIoStream *)0x0;
  local_1c8.value.ptr.field_1.value.peerIdentity.disposer = (params->peerIdentity).disposer;
  local_1c8.value.ptr.field_1.value.peerIdentity.ptr = (params->peerIdentity).ptr;
  (params->peerIdentity).ptr = (PeerIdentity *)0x0;
  _::ImmediatePromiseNode<kj::AuthenticatedStream>::ImmediatePromiseNode(location,&local_1c8);
  uVar1 = local_1c8.value.ptr.field_1.value.peerIdentity.ptr;
  if (local_1c8.value.ptr.isSet == true) {
    if (local_1c8.value.ptr.field_1.value.peerIdentity.ptr != (PeerIdentity *)0x0) {
      local_1c8.value.ptr.field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
      (**(local_1c8.value.ptr.field_1.value.peerIdentity.disposer)->_vptr_Disposer)
                (local_1c8.value.ptr.field_1.value.peerIdentity.disposer,
                 (_func_int *)
                 ((long)&((PeerIdentity *)uVar1)->_vptr_PeerIdentity +
                 (long)((PeerIdentity *)uVar1)->_vptr_PeerIdentity[-2]));
    }
    uVar1 = local_1c8.value.ptr.field_1.value.stream.ptr;
    if (local_1c8.value.ptr.field_1.value.stream.ptr != (AsyncIoStream *)0x0) {
      local_1c8.value.ptr.field_1.value.stream.ptr = (AsyncIoStream *)0x0;
      (**(local_1c8.value.ptr.field_1.value.stream.disposer)->_vptr_Disposer)
                (local_1c8.value.ptr.field_1.value.stream.disposer,
                 (_func_int *)
                 ((long)&(((AsyncIoStream *)uVar1)->super_AsyncInputStream)._vptr_AsyncInputStream +
                 (long)(((AsyncIoStream *)uVar1)->super_AsyncInputStream)._vptr_AsyncInputStream[-2]
                 ));
    }
  }
  if (local_1c8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1c8.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}